

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx::SubdivPatch1IntersectorK<4>,_true>::occluded
               (vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  long lVar2;
  uint uVar3;
  vfloat<4> vVar4;
  uint uVar5;
  BVH *bvh;
  size_t sVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined8 uVar22;
  undefined8 uVar23;
  GridSOA *pGVar24;
  size_t sVar25;
  bool bVar26;
  uint uVar27;
  undefined4 uVar28;
  int iVar29;
  size_t sVar30;
  long lVar31;
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  NodeRef *pNVar35;
  long lVar36;
  uint uVar37;
  ulong uVar38;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar39;
  NodeRef root;
  ulong uVar40;
  float fVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar69;
  float fVar70;
  undefined1 in_ZMM0 [64];
  float fVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar100;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar96;
  float fVar101;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar97;
  float fVar99;
  float fVar102;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar95;
  float fVar98;
  undefined1 auVar94 [64];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar123;
  undefined1 auVar124 [16];
  float fVar133;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [64];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar143;
  float fVar158;
  float fVar159;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar160;
  undefined1 auVar146 [16];
  float fVar161;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar162;
  float fVar173;
  float fVar175;
  undefined1 auVar163 [16];
  float fVar176;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar174;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar177;
  float fVar185;
  float fVar186;
  undefined1 auVar178 [16];
  float fVar187;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  float fVar188;
  float fVar189;
  float fVar202;
  float fVar203;
  undefined1 auVar190 [16];
  float fVar204;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  float fVar205;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  float fVar220;
  undefined1 auVar213 [16];
  float fVar221;
  float fVar222;
  float fVar223;
  undefined1 auVar224 [16];
  float fVar230;
  float fVar232;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  float fVar229;
  float fVar231;
  undefined1 auVar228 [64];
  float fVar233;
  float fVar237;
  float fVar238;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  float fVar239;
  undefined1 auVar236 [64];
  float fVar240;
  undefined1 auVar241 [16];
  float fVar246;
  undefined1 auVar242 [16];
  float fVar244;
  float fVar245;
  undefined1 auVar243 [64];
  float fVar247;
  float fVar251;
  float fVar252;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  float fVar253;
  undefined1 auVar250 [16];
  float fVar254;
  undefined1 auVar255 [16];
  undefined1 auVar256 [64];
  float local_1ba8;
  float fStack_1ba4;
  float fStack_1ba0;
  float local_1b98;
  float fStack_1b94;
  float fStack_1b90;
  RTCFilterFunctionNArguments args;
  undefined1 local_1b18 [16];
  RayK<4> *local_1b08;
  char *local_1b00;
  char *local_1af8;
  char *local_1af0;
  char *local_1ae8;
  char *local_1ae0;
  undefined1 local_1ad8 [16];
  vbool<4> terminated;
  char *local_1aa8;
  char *local_1aa0;
  Precalculations pre;
  undefined8 uStack_1a70;
  undefined8 uStack_1a60;
  vfloat<4> t;
  vfloat<4> v;
  vfloat<4> u;
  anon_union_48_2_4062524c_for_Vec3<embree::vfloat_impl<4>_>_1 local_19d8;
  undefined8 local_19a8;
  undefined8 uStack_19a0;
  float local_1998;
  float fStack_1994;
  float fStack_1990;
  float fStack_198c;
  undefined1 local_1988 [8];
  float fStack_1980;
  float fStack_197c;
  undefined1 local_1978 [16];
  uint local_1968;
  uint uStack_1964;
  uint uStack_1960;
  uint uStack_195c;
  uint uStack_1958;
  uint uStack_1954;
  uint uStack_1950;
  uint uStack_194c;
  TravRayK<4,_true> tray;
  undefined1 local_1848 [16];
  undefined1 local_1838 [16];
  undefined1 local_1828 [16];
  undefined1 local_1818 [16];
  undefined1 local_1808 [16];
  undefined1 local_17f8 [8];
  float fStack_17f0;
  float fStack_17ec;
  undefined8 local_17e8;
  undefined8 uStack_17e0;
  undefined1 local_17d8 [16];
  undefined1 local_17c8 [16];
  undefined1 local_17b8 [16];
  undefined1 local_17a8 [16];
  undefined1 local_1798 [16];
  undefined1 local_1788 [8];
  float fStack_1780;
  float fStack_177c;
  undefined8 local_1778;
  undefined8 uStack_1770;
  Vec3vf<4> Ng;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  undefined1 auVar214 [16];
  undefined1 auVar225 [16];
  
  uVar23 = mm_lookupmask_ps._8_8_;
  uVar22 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar92 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar57 = vpcmpeqd_avx(auVar92,(undefined1  [16])valid_i->field_0);
    auVar103 = ZEXT816(0) << 0x40;
    auVar13 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar103,5);
    auVar64 = auVar57 & auVar13;
    if ((((auVar64 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar64 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar64 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar64[0xf] < '\0')
    {
      auVar13 = vandps_avx(auVar13,auVar57);
      pre.super_Precalculations.grid = (GridSOA *)0x0;
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar190._8_4_ = 0x7fffffff;
      auVar190._0_8_ = 0x7fffffff7fffffff;
      auVar190._12_4_ = 0x7fffffff;
      auVar57 = vandps_avx(auVar190,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar209._8_4_ = 0x219392ef;
      auVar209._0_8_ = 0x219392ef219392ef;
      auVar209._12_4_ = 0x219392ef;
      auVar64 = vcmpps_avx(auVar57,auVar209,1);
      auVar234._8_4_ = 0x3f800000;
      auVar234._0_8_ = 0x3f8000003f800000;
      auVar234._12_4_ = 0x3f800000;
      auVar141 = vdivps_avx(auVar234,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar57 = vandps_avx(auVar190,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar144 = vcmpps_avx(auVar57,auVar209,1);
      auVar65 = vdivps_avx(auVar234,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar57 = vandps_avx(auVar190,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar57 = vcmpps_avx(auVar57,auVar209,1);
      auVar210._8_4_ = 0x5d5e0b6b;
      auVar210._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar210._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar141,auVar210,auVar64)
      ;
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar65,auVar210,auVar144)
      ;
      auVar64 = vdivps_avx(auVar234,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar64,auVar210,auVar57);
      auVar57 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar103,1);
      auVar141._8_4_ = 0x10;
      auVar141._0_8_ = 0x1000000010;
      auVar141._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar57,auVar141);
      auVar57 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar103,5);
      auVar64._8_4_ = 0x20;
      auVar64._0_8_ = 0x2000000020;
      auVar64._12_4_ = 0x20;
      auVar65._8_4_ = 0x30;
      auVar65._0_8_ = 0x3000000030;
      auVar65._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar65,auVar64,auVar57);
      auVar57 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar103,5);
      auVar144._8_4_ = 0x40;
      auVar144._0_8_ = 0x4000000040;
      auVar144._12_4_ = 0x40;
      auVar130._8_4_ = 0x50;
      auVar130._0_8_ = 0x5000000050;
      auVar130._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar130,auVar144,auVar57);
      auVar57 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar103);
      auVar64 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar103);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar236 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar57,auVar13);
      auVar94 = ZEXT1664((undefined1  [16])tray.tnear.field_0);
      auVar57._8_4_ = 0xff800000;
      auVar57._0_8_ = 0xff800000ff800000;
      auVar57._12_4_ = 0xff800000;
      auVar132 = ZEXT1664(auVar57);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar57,auVar64,auVar13);
      terminated.field_0.i[1] = auVar13._4_4_ ^ auVar92._4_4_;
      terminated.field_0.i[0] = auVar13._0_4_ ^ auVar92._0_4_;
      terminated.field_0.i[2] = auVar13._8_4_ ^ auVar92._8_4_;
      terminated.field_0.i[3] = auVar13._12_4_ ^ auVar92._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar37 = 3;
      }
      else {
        uVar37 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_1b08 = ray + 0x80;
      pNVar35 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar39 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar228 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
      auVar243 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
LAB_00ecab19:
      do {
        do {
          root.ptr = pNVar35[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_00ecc47b;
          pNVar35 = pNVar35 + -1;
          paVar39 = paVar39 + -1;
          vVar4.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar39->v;
          auVar256 = ZEXT1664((undefined1  [16])vVar4.field_0);
          auVar92 = vcmpps_avx((undefined1  [16])vVar4.field_0,(undefined1  [16])tray.tfar.field_0,1
                              );
          uVar27 = vmovmskps_avx(auVar92);
        } while (uVar27 == 0);
        uVar38 = (ulong)(uVar27 & 0xff);
        uVar27 = POPCOUNT(uVar27 & 0xff);
        if (uVar37 < uVar27) {
LAB_00ecab59:
          do {
            pGVar24 = pre.super_Precalculations.grid;
            sVar30 = 8;
            iVar29 = 4;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_00ecc47b;
              auVar92 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar256._0_16_,6);
              if ((((auVar92 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar92 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar92 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar92[0xf] < '\0') {
                auVar92 = auVar132._0_16_;
                if (((uint)root.ptr & 0xf) == 8) {
                  auVar92 = vpcmpeqd_avx(auVar92,auVar92);
                  auVar132 = ZEXT1664(auVar92);
                  auVar94 = ZEXT1664(auVar92 ^ (undefined1  [16])terminated.field_0);
                  uVar34 = (ulong)(pre.super_Precalculations.grid)->dim_offset;
                  uVar32 = (ulong)(pre.super_Precalculations.grid)->width;
                  uVar38 = (ulong)(pre.super_Precalculations.grid)->gridOffset;
                  uVar27 = (pre.super_Precalculations.grid)->height;
                  lVar36 = uVar34 * 0xc + uVar38;
                  lVar2 = uVar32 * 4;
                  uVar40 = root.ptr >> 4;
                  local_1af8 = (pre.super_Precalculations.grid)->data +
                               uVar40 * 4 + lVar36 + uVar32 * 4 + -4;
                  lVar31 = uVar38 + uVar34 * 8;
                  local_1ae0 = (pre.super_Precalculations.grid)->data +
                               uVar40 * 4 + lVar31 + uVar32 * 4;
                  lVar33 = uVar38 + uVar34 * 4;
                  local_1ae8 = (pre.super_Precalculations.grid)->data +
                               uVar40 * 4 + lVar33 + uVar32 * 4;
                  local_1af0 = (pre.super_Precalculations.grid)->data +
                               uVar40 * 4 + uVar38 + uVar32 * 4;
                  local_1b00 = (pre.super_Precalculations.grid)->data + uVar40 * 4 + lVar36;
                  local_1aa0 = (pre.super_Precalculations.grid)->data + uVar40 * 4 + lVar31;
                  local_1aa8 = (pre.super_Precalculations.grid)->data + uVar40 * 4 + lVar33;
                  lVar31 = uVar38 + uVar40 * 4 + 0x2c;
                  lVar33 = 0;
                  while (lVar33 != (ulong)(uVar27 != 2) + 1) {
                    lVar33 = lVar33 + 1;
                    lVar36 = 0;
                    do {
                      if ((ulong)(uVar32 != 2) * 4 + 4 == lVar36) break;
                      uVar28 = *(undefined4 *)(pGVar24->data + lVar36 + lVar31 + -0x30);
                      auVar235._4_4_ = uVar28;
                      auVar235._0_4_ = uVar28;
                      auVar235._8_4_ = uVar28;
                      auVar235._12_4_ = uVar28;
                      uVar28 = *(undefined4 *)(local_1aa8 + lVar36 + -4);
                      auVar49._4_4_ = uVar28;
                      auVar49._0_4_ = uVar28;
                      auVar49._8_4_ = uVar28;
                      auVar49._12_4_ = uVar28;
                      uVar28 = *(undefined4 *)(local_1aa0 + lVar36 + -4);
                      auVar74._4_4_ = uVar28;
                      auVar74._0_4_ = uVar28;
                      auVar74._8_4_ = uVar28;
                      auVar74._12_4_ = uVar28;
                      uVar28 = *(undefined4 *)(local_1af0 + lVar36 + -4);
                      auVar248._4_4_ = uVar28;
                      auVar248._0_4_ = uVar28;
                      auVar248._8_4_ = uVar28;
                      auVar248._12_4_ = uVar28;
                      uVar28 = *(undefined4 *)(local_1ae8 + lVar36 + -4);
                      auVar105._4_4_ = uVar28;
                      auVar105._0_4_ = uVar28;
                      auVar105._8_4_ = uVar28;
                      auVar105._12_4_ = uVar28;
                      uVar28 = *(undefined4 *)(local_1ae0 + lVar36 + -4);
                      auVar163._4_4_ = uVar28;
                      auVar163._0_4_ = uVar28;
                      auVar163._8_4_ = uVar28;
                      auVar163._12_4_ = uVar28;
                      auVar92 = *(undefined1 (*) [16])(ray + 0x10);
                      auVar57 = *(undefined1 (*) [16])(ray + 0x20);
                      auVar144 = vsubps_avx(auVar49,auVar92);
                      auVar141 = vsubps_avx(auVar74,auVar57);
                      auVar65 = vsubps_avx(auVar105,auVar92);
                      auVar130 = vsubps_avx(auVar163,auVar57);
                      auVar64 = vsubps_avx(auVar65,auVar144);
                      auVar190 = vsubps_avx(auVar130,auVar141);
                      fVar9 = auVar144._0_4_;
                      fVar162 = auVar65._0_4_ + fVar9;
                      fVar11 = auVar144._4_4_;
                      fVar173 = auVar65._4_4_ + fVar11;
                      fVar101 = auVar144._8_4_;
                      fVar175 = auVar65._8_4_ + fVar101;
                      fVar12 = auVar144._12_4_;
                      fVar176 = auVar65._12_4_ + fVar12;
                      fVar10 = auVar141._0_4_;
                      fVar188 = auVar130._0_4_ + fVar10;
                      fVar96 = auVar141._4_4_;
                      fVar202 = auVar130._4_4_ + fVar96;
                      fVar174 = auVar141._8_4_;
                      fVar203 = auVar130._8_4_ + fVar174;
                      fVar189 = auVar141._12_4_;
                      fVar204 = auVar130._12_4_ + fVar189;
                      auVar103 = auVar94._0_16_;
                      fVar41 = auVar190._0_4_;
                      auVar212._0_4_ = fVar162 * fVar41;
                      fVar205 = auVar190._4_4_;
                      auVar212._4_4_ = fVar173 * fVar205;
                      fVar14 = auVar190._8_4_;
                      auVar212._8_4_ = fVar175 * fVar14;
                      fVar15 = auVar190._12_4_;
                      auVar212._12_4_ = fVar176 * fVar15;
                      fVar69 = auVar64._0_4_;
                      auVar224._0_4_ = fVar188 * fVar69;
                      fVar207 = auVar64._4_4_;
                      auVar224._4_4_ = fVar202 * fVar207;
                      fVar219 = auVar64._8_4_;
                      auVar224._8_4_ = fVar203 * fVar219;
                      fVar16 = auVar64._12_4_;
                      auVar224._12_4_ = fVar204 * fVar16;
                      auVar190 = vsubps_avx(auVar224,auVar212);
                      auVar64 = *(undefined1 (*) [16])ray;
                      auVar209 = vsubps_avx(auVar235,auVar64);
                      auVar210 = vsubps_avx(auVar248,auVar64);
                      auVar234 = vsubps_avx(auVar210,auVar209);
                      fVar70 = auVar234._0_4_;
                      auVar191._0_4_ = fVar188 * fVar70;
                      fVar216 = auVar234._4_4_;
                      auVar191._4_4_ = fVar202 * fVar216;
                      fVar221 = auVar234._8_4_;
                      auVar191._8_4_ = fVar203 * fVar221;
                      fVar17 = auVar234._12_4_;
                      auVar191._12_4_ = fVar204 * fVar17;
                      fVar188 = auVar209._0_4_;
                      fVar222 = auVar210._0_4_ + fVar188;
                      fVar202 = auVar209._4_4_;
                      fVar229 = auVar210._4_4_ + fVar202;
                      fVar203 = auVar209._8_4_;
                      fVar231 = auVar210._8_4_ + fVar203;
                      fVar204 = auVar209._12_4_;
                      fVar232 = auVar210._12_4_ + fVar204;
                      auVar249._0_4_ = fVar222 * fVar41;
                      auVar249._4_4_ = fVar229 * fVar205;
                      auVar249._8_4_ = fVar231 * fVar14;
                      auVar249._12_4_ = fVar232 * fVar15;
                      auVar234 = vsubps_avx(auVar249,auVar191);
                      auVar192._0_4_ = fVar222 * fVar69;
                      auVar192._4_4_ = fVar229 * fVar207;
                      auVar192._8_4_ = fVar231 * fVar219;
                      auVar192._12_4_ = fVar232 * fVar16;
                      auVar164._0_4_ = fVar70 * fVar162;
                      auVar164._4_4_ = fVar216 * fVar173;
                      auVar164._8_4_ = fVar221 * fVar175;
                      auVar164._12_4_ = fVar17 * fVar176;
                      auVar18 = vsubps_avx(auVar164,auVar192);
                      pRVar1 = ray + 0x60;
                      auVar19 = *(undefined1 (*) [12])pRVar1;
                      fVar176 = *(float *)(ray + 0x6c);
                      auVar125 = *(undefined1 (*) [16])pRVar1;
                      fVar222 = *(float *)(ray + 0x50);
                      fVar229 = *(float *)(ray + 0x54);
                      fVar231 = *(float *)(ray + 0x58);
                      auVar20 = *(undefined1 (*) [12])(ray + 0x50);
                      fVar232 = *(float *)(ray + 0x5c);
                      fVar71 = *(float *)(ray + 0x40);
                      fVar97 = *(float *)(ray + 0x44);
                      fVar99 = *(float *)(ray + 0x48);
                      auVar21 = *(undefined1 (*) [12])(ray + 0x40);
                      fVar102 = *(float *)(ray + 0x4c);
                      fVar223 = auVar190._0_4_ * fVar71 +
                                auVar18._0_4_ * *(float *)pRVar1 + fVar222 * auVar234._0_4_;
                      fVar230 = auVar190._4_4_ * fVar97 +
                                auVar18._4_4_ * *(float *)(ray + 100) + fVar229 * auVar234._4_4_;
                      auVar225._0_8_ = CONCAT44(fVar230,fVar223);
                      auVar225._8_4_ =
                           auVar190._8_4_ * fVar99 +
                           auVar18._8_4_ * *(float *)(ray + 0x68) + fVar231 * auVar234._8_4_;
                      auVar225._12_4_ =
                           auVar190._12_4_ * fVar102 +
                           auVar18._12_4_ * fVar176 + fVar232 * auVar234._12_4_;
                      uVar28 = *(undefined4 *)(local_1aa8 + lVar36);
                      auVar50._4_4_ = uVar28;
                      auVar50._0_4_ = uVar28;
                      auVar50._8_4_ = uVar28;
                      auVar50._12_4_ = uVar28;
                      auVar92 = vsubps_avx(auVar50,auVar92);
                      uVar28 = *(undefined4 *)(local_1aa0 + lVar36);
                      auVar75._4_4_ = uVar28;
                      auVar75._0_4_ = uVar28;
                      auVar75._8_4_ = uVar28;
                      auVar75._12_4_ = uVar28;
                      auVar57 = vsubps_avx(auVar75,auVar57);
                      auVar144 = vsubps_avx(auVar144,auVar92);
                      auVar141 = vsubps_avx(auVar141,auVar57);
                      fVar177 = fVar9 + auVar92._0_4_;
                      fVar185 = fVar11 + auVar92._4_4_;
                      fVar186 = fVar101 + auVar92._8_4_;
                      fVar187 = fVar12 + auVar92._12_4_;
                      fVar162 = fVar10 + auVar57._0_4_;
                      fVar173 = fVar96 + auVar57._4_4_;
                      fVar175 = fVar174 + auVar57._8_4_;
                      fVar160 = fVar189 + auVar57._12_4_;
                      fVar247 = auVar141._0_4_;
                      auVar241._0_4_ = fVar247 * fVar177;
                      fVar251 = auVar141._4_4_;
                      auVar241._4_4_ = fVar251 * fVar185;
                      fVar252 = auVar141._8_4_;
                      auVar241._8_4_ = fVar252 * fVar186;
                      fVar253 = auVar141._12_4_;
                      auVar241._12_4_ = fVar253 * fVar187;
                      fVar123 = auVar144._0_4_;
                      auVar165._0_4_ = fVar123 * fVar162;
                      fVar208 = auVar144._4_4_;
                      auVar165._4_4_ = fVar208 * fVar173;
                      fVar217 = auVar144._8_4_;
                      auVar165._8_4_ = fVar217 * fVar175;
                      fVar133 = auVar144._12_4_;
                      auVar165._12_4_ = fVar133 * fVar160;
                      auVar144 = vsubps_avx(auVar165,auVar241);
                      uVar28 = *(undefined4 *)(pGVar24->data + lVar36 + lVar31 + -0x2c);
                      auVar193._4_4_ = uVar28;
                      auVar193._0_4_ = uVar28;
                      auVar193._8_4_ = uVar28;
                      auVar193._12_4_ = uVar28;
                      auVar64 = vsubps_avx(auVar193,auVar64);
                      auVar141 = vsubps_avx(auVar209,auVar64);
                      fVar240 = auVar141._0_4_;
                      auVar146._0_4_ = fVar240 * fVar162;
                      fVar244 = auVar141._4_4_;
                      auVar146._4_4_ = fVar244 * fVar173;
                      fVar245 = auVar141._8_4_;
                      auVar146._8_4_ = fVar245 * fVar175;
                      fVar246 = auVar141._12_4_;
                      auVar146._12_4_ = fVar246 * fVar160;
                      fVar162 = auVar64._0_4_ + fVar188;
                      fVar173 = auVar64._4_4_ + fVar202;
                      fVar175 = auVar64._8_4_ + fVar203;
                      fVar160 = auVar64._12_4_ + fVar204;
                      auVar194._0_4_ = fVar162 * fVar247;
                      auVar194._4_4_ = fVar173 * fVar251;
                      auVar194._8_4_ = fVar175 * fVar252;
                      auVar194._12_4_ = fVar160 * fVar253;
                      auVar141 = vsubps_avx(auVar194,auVar146);
                      auVar195._0_4_ = fVar162 * fVar123;
                      auVar195._4_4_ = fVar173 * fVar208;
                      auVar195._8_4_ = fVar175 * fVar217;
                      auVar195._12_4_ = fVar160 * fVar133;
                      auVar179._0_4_ = fVar240 * fVar177;
                      auVar179._4_4_ = fVar244 * fVar185;
                      auVar179._8_4_ = fVar245 * fVar186;
                      auVar179._12_4_ = fVar246 * fVar187;
                      auVar190 = vsubps_avx(auVar179,auVar195);
                      fVar162 = auVar19._0_4_;
                      fVar173 = auVar19._4_4_;
                      fVar175 = auVar19._8_4_;
                      auVar180._0_4_ =
                           fVar71 * auVar144._0_4_ +
                           auVar190._0_4_ * fVar162 + fVar222 * auVar141._0_4_;
                      auVar180._4_4_ =
                           fVar97 * auVar144._4_4_ +
                           auVar190._4_4_ * fVar173 + fVar229 * auVar141._4_4_;
                      auVar180._8_4_ =
                           fVar99 * auVar144._8_4_ +
                           auVar190._8_4_ * fVar175 + fVar231 * auVar141._8_4_;
                      auVar180._12_4_ =
                           fVar102 * auVar144._12_4_ +
                           auVar190._12_4_ * fVar176 + fVar232 * auVar141._12_4_;
                      auVar144 = vsubps_avx(auVar64,auVar210);
                      fVar143 = auVar64._0_4_ + auVar210._0_4_;
                      fVar158 = auVar64._4_4_ + auVar210._4_4_;
                      fVar159 = auVar64._8_4_ + auVar210._8_4_;
                      fVar161 = auVar64._12_4_ + auVar210._12_4_;
                      auVar64 = vsubps_avx(auVar92,auVar65);
                      fVar160 = auVar92._0_4_ + auVar65._0_4_;
                      fVar177 = auVar92._4_4_ + auVar65._4_4_;
                      fVar185 = auVar92._8_4_ + auVar65._8_4_;
                      fVar186 = auVar92._12_4_ + auVar65._12_4_;
                      auVar92 = vsubps_avx(auVar57,auVar130);
                      fVar187 = auVar57._0_4_ + auVar130._0_4_;
                      fVar95 = auVar57._4_4_ + auVar130._4_4_;
                      fVar98 = auVar57._8_4_ + auVar130._8_4_;
                      fVar100 = auVar57._12_4_ + auVar130._12_4_;
                      fVar206 = auVar92._0_4_;
                      auVar106._0_4_ = fVar206 * fVar160;
                      fVar215 = auVar92._4_4_;
                      auVar106._4_4_ = fVar215 * fVar177;
                      fVar218 = auVar92._8_4_;
                      auVar106._8_4_ = fVar218 * fVar185;
                      fVar220 = auVar92._12_4_;
                      auVar106._12_4_ = fVar220 * fVar186;
                      fVar233 = auVar64._0_4_;
                      auVar166._0_4_ = fVar233 * fVar187;
                      fVar237 = auVar64._4_4_;
                      auVar166._4_4_ = fVar237 * fVar95;
                      fVar238 = auVar64._8_4_;
                      auVar166._8_4_ = fVar238 * fVar98;
                      fVar239 = auVar64._12_4_;
                      auVar166._12_4_ = fVar239 * fVar100;
                      auVar92 = vsubps_avx(auVar166,auVar106);
                      fVar254 = auVar144._0_4_;
                      auVar76._0_4_ = fVar254 * fVar187;
                      fVar187 = auVar144._4_4_;
                      auVar76._4_4_ = fVar187 * fVar95;
                      fVar95 = auVar144._8_4_;
                      auVar76._8_4_ = fVar95 * fVar98;
                      fVar98 = auVar144._12_4_;
                      auVar76._12_4_ = fVar98 * fVar100;
                      auVar167._0_4_ = fVar206 * fVar143;
                      auVar167._4_4_ = fVar215 * fVar158;
                      auVar167._8_4_ = fVar218 * fVar159;
                      auVar167._12_4_ = fVar220 * fVar161;
                      auVar57 = vsubps_avx(auVar167,auVar76);
                      auVar168._8_4_ = 0x7fffffff;
                      auVar168._0_8_ = 0x7fffffff7fffffff;
                      auVar168._12_4_ = 0x7fffffff;
                      auVar147._0_4_ = fVar233 * fVar143;
                      auVar147._4_4_ = fVar237 * fVar158;
                      auVar147._8_4_ = fVar238 * fVar159;
                      auVar147._12_4_ = fVar239 * fVar161;
                      auVar51._0_4_ = fVar254 * fVar160;
                      auVar51._4_4_ = fVar187 * fVar177;
                      auVar51._8_4_ = fVar95 * fVar185;
                      auVar51._12_4_ = fVar98 * fVar186;
                      auVar64 = vsubps_avx(auVar51,auVar147);
                      auVar52._0_4_ =
                           fVar71 * auVar92._0_4_ +
                           auVar64._0_4_ * fVar162 + fVar222 * auVar57._0_4_;
                      auVar52._4_4_ =
                           fVar97 * auVar92._4_4_ +
                           auVar64._4_4_ * fVar173 + fVar229 * auVar57._4_4_;
                      auVar52._8_4_ =
                           fVar99 * auVar92._8_4_ +
                           auVar64._8_4_ * fVar175 + fVar231 * auVar57._8_4_;
                      auVar52._12_4_ =
                           fVar102 * auVar92._12_4_ +
                           auVar64._12_4_ * fVar176 + fVar232 * auVar57._12_4_;
                      auVar134._0_4_ = auVar52._0_4_ + fVar223 + auVar180._0_4_;
                      auVar134._4_4_ = auVar52._4_4_ + fVar230 + auVar180._4_4_;
                      auVar134._8_4_ = auVar52._8_4_ + auVar225._8_4_ + auVar180._8_4_;
                      auVar134._12_4_ = auVar52._12_4_ + auVar225._12_4_ + auVar180._12_4_;
                      auVar92 = vandps_avx(auVar134,auVar168);
                      auVar77._0_4_ = auVar92._0_4_ * 1.1920929e-07;
                      auVar77._4_4_ = auVar92._4_4_ * 1.1920929e-07;
                      auVar77._8_4_ = auVar92._8_4_ * 1.1920929e-07;
                      auVar77._12_4_ = auVar92._12_4_ * 1.1920929e-07;
                      auVar92 = vminps_avx(auVar225,auVar180);
                      auVar92 = vminps_avx(auVar92,auVar52);
                      uVar38 = CONCAT44(auVar77._4_4_,auVar77._0_4_);
                      auVar148._0_8_ = uVar38 ^ 0x8000000080000000;
                      auVar148._8_4_ = -auVar77._8_4_;
                      auVar148._12_4_ = -auVar77._12_4_;
                      auVar92 = vcmpps_avx(auVar92,auVar148,5);
                      auVar57 = vmaxps_avx(auVar225,auVar180);
                      auVar57 = vmaxps_avx(auVar57,auVar52);
                      auVar57 = vcmpps_avx(auVar57,auVar77,2);
                      auVar92 = vorps_avx(auVar92,auVar57);
                      auVar57 = auVar103 & auVar92;
                      auVar92 = vandps_avx(auVar103,auVar92);
                      if ((((auVar57 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar57 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar57 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          auVar57[0xf] < '\0') {
                        auVar53._0_4_ = fVar41 * fVar123;
                        auVar53._4_4_ = fVar205 * fVar208;
                        auVar53._8_4_ = fVar14 * fVar217;
                        auVar53._12_4_ = fVar15 * fVar133;
                        auVar78._0_4_ = fVar69 * fVar247;
                        auVar78._4_4_ = fVar207 * fVar251;
                        auVar78._8_4_ = fVar219 * fVar252;
                        auVar78._12_4_ = fVar16 * fVar253;
                        auVar144 = vsubps_avx(auVar78,auVar53);
                        auVar107._0_4_ = fVar233 * fVar247;
                        auVar107._4_4_ = fVar237 * fVar251;
                        auVar107._8_4_ = fVar238 * fVar252;
                        auVar107._12_4_ = fVar239 * fVar253;
                        auVar149._0_4_ = fVar206 * fVar123;
                        auVar149._4_4_ = fVar215 * fVar208;
                        auVar149._8_4_ = fVar218 * fVar217;
                        auVar149._12_4_ = fVar220 * fVar133;
                        auVar141 = vsubps_avx(auVar149,auVar107);
                        auVar57 = vandps_avx(auVar53,auVar168);
                        auVar64 = vandps_avx(auVar107,auVar168);
                        auVar57 = vcmpps_avx(auVar57,auVar64,1);
                        auVar144 = vblendvps_avx(auVar141,auVar144,auVar57);
                        auVar54._0_4_ = fVar240 * fVar206;
                        auVar54._4_4_ = fVar244 * fVar215;
                        auVar54._8_4_ = fVar245 * fVar218;
                        auVar54._12_4_ = fVar246 * fVar220;
                        auVar79._0_4_ = fVar240 * fVar41;
                        auVar79._4_4_ = fVar244 * fVar205;
                        auVar79._8_4_ = fVar245 * fVar14;
                        auVar79._12_4_ = fVar246 * fVar15;
                        auVar135._0_4_ = fVar70 * fVar247;
                        auVar135._4_4_ = fVar216 * fVar251;
                        auVar135._8_4_ = fVar221 * fVar252;
                        auVar135._12_4_ = fVar17 * fVar253;
                        auVar141 = vsubps_avx(auVar79,auVar135);
                        auVar150._0_4_ = fVar254 * fVar247;
                        auVar150._4_4_ = fVar187 * fVar251;
                        auVar150._8_4_ = fVar95 * fVar252;
                        auVar150._12_4_ = fVar98 * fVar253;
                        auVar65 = vsubps_avx(auVar150,auVar54);
                        auVar57 = vandps_avx(auVar135,auVar168);
                        auVar64 = vandps_avx(auVar54,auVar168);
                        auVar57 = vcmpps_avx(auVar57,auVar64,1);
                        auVar141 = vblendvps_avx(auVar65,auVar141,auVar57);
                        auVar55._0_4_ = fVar254 * fVar123;
                        auVar55._4_4_ = fVar187 * fVar208;
                        auVar55._8_4_ = fVar95 * fVar217;
                        auVar55._12_4_ = fVar98 * fVar133;
                        auVar80._0_4_ = fVar70 * fVar123;
                        auVar80._4_4_ = fVar216 * fVar208;
                        auVar80._8_4_ = fVar221 * fVar217;
                        auVar80._12_4_ = fVar17 * fVar133;
                        auVar151._0_4_ = fVar240 * fVar69;
                        auVar151._4_4_ = fVar244 * fVar207;
                        auVar151._8_4_ = fVar245 * fVar219;
                        auVar151._12_4_ = fVar246 * fVar16;
                        auVar169._0_4_ = fVar240 * fVar233;
                        auVar169._4_4_ = fVar244 * fVar237;
                        auVar169._8_4_ = fVar245 * fVar238;
                        auVar169._12_4_ = fVar246 * fVar239;
                        auVar65 = vsubps_avx(auVar80,auVar151);
                        auVar130 = vsubps_avx(auVar169,auVar55);
                        auVar57 = vandps_avx(auVar168,auVar151);
                        auVar64 = vandps_avx(auVar168,auVar55);
                        auVar57 = vcmpps_avx(auVar57,auVar64,1);
                        auVar64 = vblendvps_avx(auVar130,auVar65,auVar57);
                        local_1b98 = auVar20._0_4_;
                        fStack_1b94 = auVar20._4_4_;
                        fStack_1b90 = auVar20._8_4_;
                        local_1ba8 = auVar21._0_4_;
                        fStack_1ba4 = auVar21._4_4_;
                        fStack_1ba0 = auVar21._8_4_;
                        fVar41 = auVar144._0_4_ * local_1ba8 +
                                 auVar64._0_4_ * fVar162 + auVar141._0_4_ * local_1b98;
                        fVar69 = auVar144._4_4_ * fStack_1ba4 +
                                 auVar64._4_4_ * fVar173 + auVar141._4_4_ * fStack_1b94;
                        fVar70 = auVar144._8_4_ * fStack_1ba0 +
                                 auVar64._8_4_ * fVar175 + auVar141._8_4_ * fStack_1b90;
                        fVar162 = auVar144._12_4_ * fVar102 +
                                  auVar64._12_4_ * fVar176 + auVar141._12_4_ * fVar232;
                        auVar56._0_4_ = fVar41 + fVar41;
                        auVar56._4_4_ = fVar69 + fVar69;
                        auVar56._8_4_ = fVar70 + fVar70;
                        auVar56._12_4_ = fVar162 + fVar162;
                        fVar41 = auVar144._0_4_ * fVar188 +
                                 auVar64._0_4_ * fVar10 + auVar141._0_4_ * fVar9;
                        fVar96 = auVar144._4_4_ * fVar202 +
                                 auVar64._4_4_ * fVar96 + auVar141._4_4_ * fVar11;
                        fVar202 = auVar144._8_4_ * fVar203 +
                                  auVar64._8_4_ * fVar174 + auVar141._8_4_ * fVar101;
                        fVar101 = auVar144._12_4_ * fVar204 +
                                  auVar64._12_4_ * fVar189 + auVar141._12_4_ * fVar12;
                        auVar57 = vrcpps_avx(auVar56);
                        fVar9 = auVar57._0_4_;
                        auVar170._0_4_ = auVar56._0_4_ * fVar9;
                        fVar10 = auVar57._4_4_;
                        auVar170._4_4_ = auVar56._4_4_ * fVar10;
                        fVar188 = auVar57._8_4_;
                        auVar170._8_4_ = auVar56._8_4_ * fVar188;
                        fVar11 = auVar57._12_4_;
                        auVar170._12_4_ = auVar56._12_4_ * fVar11;
                        auVar196._8_4_ = 0x3f800000;
                        auVar196._0_8_ = 0x3f8000003f800000;
                        auVar196._12_4_ = 0x3f800000;
                        auVar57 = vsubps_avx(auVar196,auVar170);
                        auVar81._0_4_ = (fVar41 + fVar41) * (fVar9 + fVar9 * auVar57._0_4_);
                        auVar81._4_4_ = (fVar96 + fVar96) * (fVar10 + fVar10 * auVar57._4_4_);
                        auVar81._8_4_ = (fVar202 + fVar202) * (fVar188 + fVar188 * auVar57._8_4_);
                        auVar81._12_4_ = (fVar101 + fVar101) * (fVar11 + fVar11 * auVar57._12_4_);
                        auVar57 = vcmpps_avx(auVar81,*(undefined1 (*) [16])(ray + 0x80),2);
                        auVar65 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar81,2);
                        auVar57 = vandps_avx(auVar65,auVar57);
                        auVar65 = vcmpps_avx(auVar56,_DAT_01f45a50,4);
                        auVar57 = vandps_avx(auVar65,auVar57);
                        auVar57 = vpslld_avx(auVar57,0x1f);
                        auVar57 = vpsrad_avx(auVar57,0x1f);
                        auVar65 = auVar92 & auVar57;
                        auVar57 = vandps_avx(auVar57,auVar92);
                        auVar125 = auVar92;
                        auVar92 = auVar57;
                        if ((((auVar65 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar65 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar65 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            auVar65[0xf] < '\0') {
                          uStack_1a60 = auVar225._8_8_;
                          uStack_1770 = uStack_1a60;
                          auVar125 = auVar134;
                          local_17d8 = auVar64;
                          local_17c8 = auVar141;
                          local_17b8 = auVar144;
                          local_17a8 = auVar81;
                          local_1798 = auVar134;
                          _local_1788 = auVar180;
                          local_1778 = auVar225._0_8_;
                        }
                      }
                      auVar236 = ZEXT1664(CONCAT412(0x7f800000,
                                                    CONCAT48(0x7f800000,0x7f8000007f800000)));
                      auVar228 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                    CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
                      auVar243 = ZEXT1664(CONCAT412(0x3f800003,
                                                    CONCAT48(0x3f800003,0x3f8000033f800003)));
                      auVar57 = vpcmpeqd_avx(auVar125,auVar125);
                      auVar132 = ZEXT1664(auVar57);
                      uVar28 = *(undefined4 *)(local_1af0 + lVar36);
                      local_1ad8._4_4_ = uVar28;
                      local_1ad8._0_4_ = uVar28;
                      local_1ad8._8_4_ = uVar28;
                      local_1ad8._12_4_ = uVar28;
                      uVar28 = *(undefined4 *)(local_1ae8 + lVar36);
                      auVar250._4_4_ = uVar28;
                      auVar250._0_4_ = uVar28;
                      auVar250._8_4_ = uVar28;
                      auVar250._12_4_ = uVar28;
                      uVar28 = *(undefined4 *)(local_1ae0 + lVar36);
                      auVar197._4_4_ = uVar28;
                      auVar197._0_4_ = uVar28;
                      auVar197._8_4_ = uVar28;
                      auVar197._12_4_ = uVar28;
                      uVar5 = (pre.super_Precalculations.grid)->_geomID;
                      pGVar7 = (context->scene->geometries).items[uVar5].ptr;
                      uVar3 = pGVar7->mask;
                      auVar82._4_4_ = uVar3;
                      auVar82._0_4_ = uVar3;
                      auVar82._8_4_ = uVar3;
                      auVar82._12_4_ = uVar3;
                      auVar57 = vandps_avx(auVar82,*(undefined1 (*) [16])(ray + 0x90));
                      auVar57 = vpcmpeqd_avx(auVar57,_DAT_01f45a50);
                      auVar64 = auVar92 & ~auVar57;
                      auVar144 = local_1ad8;
                      if ((((auVar64 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar64 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar64 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          auVar64[0xf] < '\0') {
                        uVar3 = (pre.super_Precalculations.grid)->_primID;
                        auVar92 = vandnps_avx(auVar57,auVar92);
                        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                           (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                          auVar57 = vandps_avx(auVar168,local_1798);
                          auVar64 = vrcpps_avx(local_1798);
                          fVar9 = auVar64._0_4_;
                          auVar114._0_4_ = local_1798._0_4_ * fVar9;
                          fVar10 = auVar64._4_4_;
                          auVar114._4_4_ = local_1798._4_4_ * fVar10;
                          fVar188 = auVar64._8_4_;
                          auVar114._8_4_ = local_1798._8_4_ * fVar188;
                          fVar11 = auVar64._12_4_;
                          auVar114._12_4_ = local_1798._12_4_ * fVar11;
                          auVar156._8_4_ = 0x3f800000;
                          auVar156._0_8_ = 0x3f8000003f800000;
                          auVar156._12_4_ = 0x3f800000;
                          auVar64 = vsubps_avx(auVar156,auVar114);
                          auVar88._0_4_ = fVar9 + fVar9 * auVar64._0_4_;
                          auVar88._4_4_ = fVar10 + fVar10 * auVar64._4_4_;
                          auVar88._8_4_ = fVar188 + fVar188 * auVar64._8_4_;
                          auVar88._12_4_ = fVar11 + fVar11 * auVar64._12_4_;
                          auVar115._8_4_ = 0x219392ef;
                          auVar115._0_8_ = 0x219392ef219392ef;
                          auVar115._12_4_ = 0x219392ef;
                          auVar57 = vcmpps_avx(auVar57,auVar115,5);
                          auVar57 = vandps_avx(auVar57,auVar88);
                          auVar66._0_4_ = auVar57._0_4_ * (float)local_1778;
                          auVar66._4_4_ = auVar57._4_4_ * local_1778._4_4_;
                          auVar66._8_4_ = auVar57._8_4_ * (float)uStack_1770;
                          auVar66._12_4_ = auVar57._12_4_ * uStack_1770._4_4_;
                          auVar190 = vminps_avx(auVar66,auVar156);
                          auVar89._0_4_ = auVar57._0_4_ * (float)local_1788._0_4_;
                          auVar89._4_4_ = auVar57._4_4_ * (float)local_1788._4_4_;
                          auVar89._8_4_ = auVar57._8_4_ * fStack_1780;
                          auVar89._12_4_ = auVar57._12_4_ * fStack_177c;
                          auVar209 = vminps_avx(auVar89,auVar156);
                          uVar28 = *(undefined4 *)(local_1b00 + lVar36 + -4);
                          auVar116._4_4_ = uVar28;
                          auVar116._0_4_ = uVar28;
                          auVar116._8_4_ = uVar28;
                          auVar116._12_4_ = uVar28;
                          auVar64 = vpsrld_avx(auVar116,0x10);
                          auVar65 = ZEXT816(0) << 0x40;
                          auVar57 = vpblendw_avx(auVar116,auVar65,0xaa);
                          auVar57 = vcvtdq2ps_avx(auVar57);
                          auVar64 = vcvtdq2ps_avx(auVar64);
                          uVar28 = *(undefined4 *)(local_1af8 + lVar36);
                          auVar138._4_4_ = uVar28;
                          auVar138._0_4_ = uVar28;
                          auVar138._8_4_ = uVar28;
                          auVar138._12_4_ = uVar28;
                          auVar144 = vsubps_avx(auVar156,auVar190);
                          auVar210 = vsubps_avx(auVar144,auVar209);
                          auVar144 = vpblendw_avx(auVar138,auVar65,0xaa);
                          auVar144 = vcvtdq2ps_avx(auVar144);
                          auVar141 = vpsrld_avx(auVar138,0x10);
                          auVar141 = vcvtdq2ps_avx(auVar141);
                          uVar28 = *(undefined4 *)(local_1b00 + lVar36);
                          auVar139._4_4_ = uVar28;
                          auVar139._0_4_ = uVar28;
                          auVar139._8_4_ = uVar28;
                          auVar139._12_4_ = uVar28;
                          auVar65 = vpblendw_avx(auVar139,auVar65,0xaa);
                          auVar65 = vcvtdq2ps_avx(auVar65);
                          auVar130 = vpsrld_avx(auVar139,0x10);
                          auVar130 = vcvtdq2ps_avx(auVar130);
                          auVar129._0_4_ = auVar130._0_4_ * 0.00012207031;
                          auVar129._4_4_ = auVar130._4_4_ * 0.00012207031;
                          auVar129._8_4_ = auVar130._8_4_ * 0.00012207031;
                          auVar129._12_4_ = auVar130._12_4_ * 0.00012207031;
                          local_19d8._0_8_ = local_17b8._0_8_;
                          local_19d8._8_8_ = local_17b8._8_8_;
                          local_19d8._16_8_ = local_17c8._0_8_;
                          local_19d8._24_8_ = local_17c8._8_8_;
                          local_19d8._32_8_ = local_17d8._0_8_;
                          local_19d8._40_8_ = local_17d8._8_8_;
                          local_19a8 = local_17a8._0_8_;
                          uStack_19a0 = local_17a8._8_8_;
                          fStack_1994 = auVar190._4_4_ * auVar129._4_4_ +
                                        auVar210._4_4_ * auVar64._4_4_ * 0.00012207031 +
                                        auVar209._4_4_ * auVar141._4_4_ * 0.00012207031;
                          local_1998 = auVar190._0_4_ * auVar129._0_4_ +
                                       auVar210._0_4_ * auVar64._0_4_ * 0.00012207031 +
                                       auVar209._0_4_ * auVar141._0_4_ * 0.00012207031;
                          fStack_1990 = auVar190._8_4_ * auVar129._8_4_ +
                                        auVar210._8_4_ * auVar64._8_4_ * 0.00012207031 +
                                        auVar209._8_4_ * auVar141._8_4_ * 0.00012207031;
                          fStack_198c = auVar190._12_4_ * auVar129._12_4_ +
                                        auVar210._12_4_ * auVar64._12_4_ * 0.00012207031 +
                                        auVar209._12_4_ * auVar141._12_4_ * 0.00012207031;
                          local_1988._4_4_ =
                               auVar190._4_4_ * auVar65._4_4_ * 0.00012207031 +
                               auVar210._4_4_ * auVar57._4_4_ * 0.00012207031 +
                               auVar209._4_4_ * auVar144._4_4_ * 0.00012207031;
                          local_1988._0_4_ =
                               auVar190._0_4_ * auVar65._0_4_ * 0.00012207031 +
                               auVar210._0_4_ * auVar57._0_4_ * 0.00012207031 +
                               auVar209._0_4_ * auVar144._0_4_ * 0.00012207031;
                          fStack_1980 = auVar190._8_4_ * auVar65._8_4_ * 0.00012207031 +
                                        auVar210._8_4_ * auVar57._8_4_ * 0.00012207031 +
                                        auVar209._8_4_ * auVar144._8_4_ * 0.00012207031;
                          fStack_197c = auVar190._12_4_ * auVar65._12_4_ * 0.00012207031 +
                                        auVar210._12_4_ * auVar57._12_4_ * 0.00012207031 +
                                        auVar209._12_4_ * auVar144._12_4_ * 0.00012207031;
                          args.valid = (int *)&Ng;
                          args.geometryUserPtr = &t;
                          args.context = (RTCRayQueryContext *)&v;
                          args.ray = (RTCRayN *)&u;
                          std::
                          _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
                          ::
                          _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                                    ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                                      *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                               *)&local_19d8.field_0);
                          local_1978 = vpshufd_avx(ZEXT416(uVar5),0);
                          _local_1988 = vshufps_avx(ZEXT416(uVar3),ZEXT416(uVar3),0);
                          local_19d8._0_8_ = Ng.field_0._0_8_;
                          local_19d8._8_8_ = Ng.field_0._8_8_;
                          local_19d8._16_8_ = Ng.field_0._16_8_;
                          local_19d8._24_8_ = Ng.field_0._24_8_;
                          local_19d8._32_8_ = Ng.field_0._32_8_;
                          local_19d8._40_8_ = Ng.field_0._40_8_;
                          local_19a8 = u.field_0._0_8_;
                          uStack_19a0 = u.field_0._8_8_;
                          vcmpps_avx(ZEXT1632(local_1978),ZEXT1632(local_1978),0xf);
                          uStack_1964 = context->user->instID[0];
                          local_1968 = uStack_1964;
                          uStack_1960 = uStack_1964;
                          uStack_195c = uStack_1964;
                          uStack_1958 = context->user->instPrimID[0];
                          uStack_1954 = uStack_1958;
                          uStack_1950 = uStack_1958;
                          uStack_194c = uStack_1958;
                          auVar57 = *(undefined1 (*) [16])(ray + 0x80);
                          auVar64 = vblendvps_avx(auVar57,(undefined1  [16])t.field_0,auVar92);
                          *(undefined1 (*) [16])(ray + 0x80) = auVar64;
                          args.valid = (int *)local_1b18;
                          args.geometryUserPtr = pGVar7->userPtr;
                          args.context = context->user;
                          args.hit = (RTCHitN *)&local_19d8;
                          args.N = 4;
                          args.ray = (RTCRayN *)ray;
                          local_1b18 = auVar92;
                          if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            (*pGVar7->occlusionFilterN)(&args);
                          }
                          if (local_1b18 == (undefined1  [16])0x0) {
                            auVar92 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                            auVar64 = vpcmpeqd_avx(auVar129,auVar129);
                            auVar132 = ZEXT1664(auVar64);
                            auVar92 = auVar92 ^ auVar64;
                            auVar236 = ZEXT1664(CONCAT412(0x7f800000,
                                                          CONCAT48(0x7f800000,0x7f8000007f800000)));
                            auVar228 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                          CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
                            auVar243 = ZEXT1664(CONCAT412(0x3f800003,
                                                          CONCAT48(0x3f800003,0x3f8000033f800003)));
                          }
                          else {
                            p_Var8 = context->args->filter;
                            auVar92 = vpcmpeqd_avx(auVar129,auVar129);
                            auVar132 = ZEXT1664(auVar92);
                            if (p_Var8 == (RTCFilterFunctionN)0x0) {
                              auVar236 = ZEXT1664(CONCAT412(0x7f800000,
                                                            CONCAT48(0x7f800000,0x7f8000007f800000))
                                                 );
                              auVar228 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                            CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa))
                                                 );
                              auVar243 = ZEXT1664(CONCAT412(0x3f800003,
                                                            CONCAT48(0x3f800003,0x3f8000033f800003))
                                                 );
                            }
                            else {
                              auVar236 = ZEXT1664(CONCAT412(0x7f800000,
                                                            CONCAT48(0x7f800000,0x7f8000007f800000))
                                                 );
                              auVar228 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                            CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa))
                                                 );
                              auVar243 = ZEXT1664(CONCAT412(0x3f800003,
                                                            CONCAT48(0x3f800003,0x3f8000033f800003))
                                                 );
                              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                 (((pGVar7->field_8).field_0x2 & 0x40) != 0)) {
                                (*p_Var8)(&args);
                                auVar92 = vpcmpeqd_avx(auVar92,auVar92);
                                auVar132 = ZEXT1664(auVar92);
                                auVar243 = ZEXT1664(CONCAT412(0x3f800003,
                                                              CONCAT48(0x3f800003,0x3f8000033f800003
                                                                      )));
                                auVar228 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                              CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa
                                                                      )));
                                auVar236 = ZEXT1664(CONCAT412(0x7f800000,
                                                              CONCAT48(0x7f800000,0x7f8000007f800000
                                                                      )));
                              }
                            }
                            auVar64 = vpcmpeqd_avx(local_1b18,_DAT_01f45a50);
                            auVar92 = auVar64 ^ auVar132._0_16_;
                            auVar120._8_4_ = 0xff800000;
                            auVar120._0_8_ = 0xff800000ff800000;
                            auVar120._12_4_ = 0xff800000;
                            auVar64 = vblendvps_avx(auVar120,*(undefined1 (*) [16])(args.ray + 0x80)
                                                    ,auVar64);
                            *(undefined1 (*) [16])(args.ray + 0x80) = auVar64;
                          }
                          auVar64 = vpslld_avx(auVar92,0x1f);
                          auVar92 = vpsrad_avx(auVar64,0x1f);
                          auVar57 = vblendvps_avx(auVar57,*(undefined1 (*) [16])local_1b08,auVar64);
                          *(undefined1 (*) [16])local_1b08 = auVar57;
                          auVar209 = local_1ad8;
                          auVar144 = local_1ad8;
                        }
                        local_1ad8 = auVar209;
                        auVar103 = vpandn_avx(auVar92,auVar103);
                        auVar209 = local_1ad8;
                      }
                      local_1ad8 = auVar209;
                      auVar94 = ZEXT1664(auVar103);
                      if ((((auVar103 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar103 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar103 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          -1 < auVar103[0xf]) break;
                      auVar92 = *(undefined1 (*) [16])ray;
                      auVar57 = *(undefined1 (*) [16])(ray + 0x10);
                      auVar64 = *(undefined1 (*) [16])(ray + 0x20);
                      auVar141 = vsubps_avx(auVar248,auVar92);
                      local_1ad8 = vsubps_avx(auVar105,auVar57);
                      auVar65 = vsubps_avx(auVar163,auVar64);
                      auVar130 = vsubps_avx(auVar193,auVar92);
                      auVar190 = vsubps_avx(auVar50,auVar57);
                      auVar209 = vsubps_avx(auVar75,auVar64);
                      auVar144 = vsubps_avx(auVar144,auVar92);
                      auVar57 = vsubps_avx(auVar250,auVar57);
                      auVar64 = vsubps_avx(auVar197,auVar64);
                      auVar92 = vsubps_avx(auVar144,auVar141);
                      auVar210 = vsubps_avx(auVar57,local_1ad8);
                      auVar234 = vsubps_avx(auVar64,auVar65);
                      fVar161 = local_1ad8._0_4_;
                      fVar101 = fVar161 + auVar57._0_4_;
                      fVar215 = local_1ad8._4_4_;
                      fVar174 = fVar215 + auVar57._4_4_;
                      fVar220 = local_1ad8._8_4_;
                      fVar203 = fVar220 + auVar57._8_4_;
                      fVar230 = local_1ad8._12_4_;
                      fVar204 = fVar230 + auVar57._12_4_;
                      fVar251 = auVar65._0_4_;
                      fVar189 = fVar251 + auVar64._0_4_;
                      fVar252 = auVar65._4_4_;
                      fVar41 = fVar252 + auVar64._4_4_;
                      fVar253 = auVar65._8_4_;
                      fVar69 = fVar253 + auVar64._8_4_;
                      fVar254 = auVar65._12_4_;
                      fVar205 = fVar254 + auVar64._12_4_;
                      fVar96 = auVar234._0_4_;
                      auVar213._0_4_ = fVar101 * fVar96;
                      fVar12 = auVar234._4_4_;
                      auVar213._4_4_ = fVar174 * fVar12;
                      fVar70 = auVar234._8_4_;
                      auVar213._8_4_ = fVar203 * fVar70;
                      fVar173 = auVar234._12_4_;
                      auVar213._12_4_ = fVar204 * fVar173;
                      fVar237 = auVar210._0_4_;
                      auVar226._0_4_ = fVar237 * fVar189;
                      fVar239 = auVar210._4_4_;
                      auVar226._4_4_ = fVar239 * fVar41;
                      fVar244 = auVar210._8_4_;
                      auVar226._8_4_ = fVar244 * fVar69;
                      fVar246 = auVar210._12_4_;
                      auVar226._12_4_ = fVar246 * fVar205;
                      auVar210 = vsubps_avx(auVar226,auVar213);
                      fVar9 = auVar141._0_4_;
                      fVar207 = auVar144._0_4_ + fVar9;
                      fVar10 = auVar141._4_4_;
                      fVar216 = auVar144._4_4_ + fVar10;
                      fVar188 = auVar141._8_4_;
                      fVar219 = auVar144._8_4_ + fVar188;
                      fVar11 = auVar141._12_4_;
                      fVar221 = auVar144._12_4_ + fVar11;
                      fVar202 = auVar92._0_4_;
                      auVar198._0_4_ = fVar189 * fVar202;
                      fVar189 = auVar92._4_4_;
                      auVar198._4_4_ = fVar41 * fVar189;
                      fVar162 = auVar92._8_4_;
                      auVar198._8_4_ = fVar69 * fVar162;
                      fVar14 = auVar92._12_4_;
                      auVar198._12_4_ = fVar205 * fVar14;
                      auVar227._0_4_ = fVar207 * fVar96;
                      auVar227._4_4_ = fVar216 * fVar12;
                      auVar227._8_4_ = fVar219 * fVar70;
                      auVar227._12_4_ = fVar221 * fVar173;
                      auVar234 = vsubps_avx(auVar227,auVar198);
                      auVar199._0_4_ = fVar207 * fVar237;
                      auVar199._4_4_ = fVar216 * fVar239;
                      auVar199._8_4_ = fVar219 * fVar244;
                      auVar199._12_4_ = fVar221 * fVar246;
                      auVar171._0_4_ = fVar202 * fVar101;
                      auVar171._4_4_ = fVar189 * fVar174;
                      auVar171._8_4_ = fVar162 * fVar203;
                      auVar171._12_4_ = fVar14 * fVar204;
                      auVar18 = vsubps_avx(auVar171,auVar199);
                      auVar92 = *(undefined1 (*) [16])(ray + 0x60);
                      fVar238 = auVar92._0_4_;
                      fVar240 = auVar92._4_4_;
                      fVar245 = auVar92._8_4_;
                      fVar247 = auVar92._12_4_;
                      auVar92 = *(undefined1 (*) [16])(ray + 0x50);
                      fVar101 = auVar92._0_4_;
                      fVar204 = auVar92._4_4_;
                      fVar205 = auVar92._8_4_;
                      fVar219 = auVar92._12_4_;
                      fVar15 = *(float *)(ray + 0x40);
                      fVar16 = *(float *)(ray + 0x44);
                      fVar17 = *(float *)(ray + 0x48);
                      auVar19 = *(undefined1 (*) [12])(ray + 0x40);
                      fVar176 = *(float *)(ray + 0x4c);
                      fVar208 = fVar15 * auVar210._0_4_ +
                                auVar234._0_4_ * fVar101 + fVar238 * auVar18._0_4_;
                      fVar217 = fVar16 * auVar210._4_4_ +
                                auVar234._4_4_ * fVar204 + fVar240 * auVar18._4_4_;
                      auVar214._0_8_ = CONCAT44(fVar217,fVar208);
                      auVar214._8_4_ =
                           fVar17 * auVar210._8_4_ +
                           auVar234._8_4_ * fVar205 + fVar245 * auVar18._8_4_;
                      auVar214._12_4_ =
                           fVar176 * auVar210._12_4_ +
                           auVar234._12_4_ * fVar219 + fVar247 * auVar18._12_4_;
                      auVar92 = vsubps_avx(local_1ad8,auVar190);
                      auVar65 = vsubps_avx(auVar65,auVar209);
                      fVar203 = fVar161 + auVar190._0_4_;
                      fVar69 = fVar215 + auVar190._4_4_;
                      fVar216 = fVar220 + auVar190._8_4_;
                      fVar175 = fVar230 + auVar190._12_4_;
                      fVar222 = fVar251 + auVar209._0_4_;
                      fVar229 = fVar252 + auVar209._4_4_;
                      fVar231 = fVar253 + auVar209._8_4_;
                      fVar232 = fVar254 + auVar209._12_4_;
                      fVar133 = auVar65._0_4_;
                      auVar242._0_4_ = fVar133 * fVar203;
                      fVar143 = auVar65._4_4_;
                      auVar242._4_4_ = fVar143 * fVar69;
                      fVar158 = auVar65._8_4_;
                      auVar242._8_4_ = fVar158 * fVar216;
                      fVar159 = auVar65._12_4_;
                      auVar242._12_4_ = fVar159 * fVar175;
                      fVar174 = auVar92._0_4_;
                      auVar108._0_4_ = fVar222 * fVar174;
                      fVar41 = auVar92._4_4_;
                      auVar108._4_4_ = fVar229 * fVar41;
                      fVar207 = auVar92._8_4_;
                      auVar108._8_4_ = fVar231 * fVar207;
                      fVar221 = auVar92._12_4_;
                      auVar108._12_4_ = fVar232 * fVar221;
                      auVar92 = vsubps_avx(auVar108,auVar242);
                      auVar141 = vsubps_avx(auVar141,auVar130);
                      fVar206 = auVar141._0_4_;
                      auVar255._0_4_ = fVar206 * fVar222;
                      fVar218 = auVar141._4_4_;
                      auVar255._4_4_ = fVar218 * fVar229;
                      fVar223 = auVar141._8_4_;
                      auVar255._8_4_ = fVar223 * fVar231;
                      fVar233 = auVar141._12_4_;
                      auVar255._12_4_ = fVar233 * fVar232;
                      fVar222 = fVar9 + auVar130._0_4_;
                      fVar229 = fVar10 + auVar130._4_4_;
                      fVar231 = fVar188 + auVar130._8_4_;
                      fVar232 = fVar11 + auVar130._12_4_;
                      auVar200._0_4_ = fVar133 * fVar222;
                      auVar200._4_4_ = fVar143 * fVar229;
                      auVar200._8_4_ = fVar158 * fVar231;
                      auVar200._12_4_ = fVar159 * fVar232;
                      auVar141 = vsubps_avx(auVar200,auVar255);
                      auVar181._0_4_ = fVar222 * fVar174;
                      auVar181._4_4_ = fVar229 * fVar41;
                      auVar181._8_4_ = fVar231 * fVar207;
                      auVar181._12_4_ = fVar232 * fVar221;
                      auVar172._0_4_ = fVar206 * fVar203;
                      auVar172._4_4_ = fVar218 * fVar69;
                      auVar172._8_4_ = fVar223 * fVar216;
                      auVar172._12_4_ = fVar233 * fVar175;
                      auVar65 = vsubps_avx(auVar172,auVar181);
                      auVar182._0_4_ =
                           fVar15 * auVar92._0_4_ +
                           fVar238 * auVar65._0_4_ + auVar141._0_4_ * fVar101;
                      auVar182._4_4_ =
                           fVar16 * auVar92._4_4_ +
                           fVar240 * auVar65._4_4_ + auVar141._4_4_ * fVar204;
                      auVar182._8_4_ =
                           fVar17 * auVar92._8_4_ +
                           fVar245 * auVar65._8_4_ + auVar141._8_4_ * fVar205;
                      auVar182._12_4_ =
                           fVar176 * auVar92._12_4_ +
                           fVar247 * auVar65._12_4_ + auVar141._12_4_ * fVar219;
                      auVar92 = vsubps_avx(auVar130,auVar144);
                      fVar71 = auVar144._0_4_ + auVar130._0_4_;
                      fVar97 = auVar144._4_4_ + auVar130._4_4_;
                      fVar99 = auVar144._8_4_ + auVar130._8_4_;
                      fVar102 = auVar144._12_4_ + auVar130._12_4_;
                      auVar144 = vsubps_avx(auVar190,auVar57);
                      fVar222 = auVar190._0_4_ + auVar57._0_4_;
                      fVar229 = auVar190._4_4_ + auVar57._4_4_;
                      fVar231 = auVar190._8_4_ + auVar57._8_4_;
                      fVar232 = auVar190._12_4_ + auVar57._12_4_;
                      auVar57 = vsubps_avx(auVar209,auVar64);
                      fVar160 = auVar209._0_4_ + auVar64._0_4_;
                      fVar177 = auVar209._4_4_ + auVar64._4_4_;
                      fVar185 = auVar209._8_4_ + auVar64._8_4_;
                      fVar186 = auVar209._12_4_ + auVar64._12_4_;
                      fVar203 = auVar57._0_4_;
                      auVar126._0_4_ = fVar222 * fVar203;
                      fVar69 = auVar57._4_4_;
                      auVar126._4_4_ = fVar229 * fVar69;
                      fVar216 = auVar57._8_4_;
                      auVar126._8_4_ = fVar231 * fVar216;
                      fVar175 = auVar57._12_4_;
                      auVar126._12_4_ = fVar232 * fVar175;
                      fVar95 = auVar144._0_4_;
                      auVar152._0_4_ = fVar95 * fVar160;
                      fVar98 = auVar144._4_4_;
                      auVar152._4_4_ = fVar98 * fVar177;
                      fVar100 = auVar144._8_4_;
                      auVar152._8_4_ = fVar100 * fVar185;
                      fVar123 = auVar144._12_4_;
                      auVar152._12_4_ = fVar123 * fVar186;
                      auVar57 = vsubps_avx(auVar152,auVar126);
                      fVar187 = auVar92._0_4_;
                      auVar109._0_4_ = fVar187 * fVar160;
                      fVar160 = auVar92._4_4_;
                      auVar109._4_4_ = fVar160 * fVar177;
                      fVar177 = auVar92._8_4_;
                      auVar109._8_4_ = fVar177 * fVar185;
                      fVar185 = auVar92._12_4_;
                      auVar109._12_4_ = fVar185 * fVar186;
                      auVar153._0_4_ = fVar71 * fVar203;
                      auVar153._4_4_ = fVar97 * fVar69;
                      auVar153._8_4_ = fVar99 * fVar216;
                      auVar153._12_4_ = fVar102 * fVar175;
                      auVar92 = vsubps_avx(auVar153,auVar109);
                      auVar154._8_4_ = 0x7fffffff;
                      auVar154._0_8_ = 0x7fffffff7fffffff;
                      auVar154._12_4_ = 0x7fffffff;
                      auVar83._0_4_ = fVar95 * fVar71;
                      auVar83._4_4_ = fVar98 * fVar97;
                      auVar83._8_4_ = fVar100 * fVar99;
                      auVar83._12_4_ = fVar123 * fVar102;
                      auVar58._0_4_ = fVar187 * fVar222;
                      auVar58._4_4_ = fVar160 * fVar229;
                      auVar58._8_4_ = fVar177 * fVar231;
                      auVar58._12_4_ = fVar185 * fVar232;
                      auVar64 = vsubps_avx(auVar58,auVar83);
                      auVar59._0_4_ =
                           fVar15 * auVar57._0_4_ +
                           fVar238 * auVar64._0_4_ + fVar101 * auVar92._0_4_;
                      auVar59._4_4_ =
                           fVar16 * auVar57._4_4_ +
                           fVar240 * auVar64._4_4_ + fVar204 * auVar92._4_4_;
                      auVar59._8_4_ =
                           fVar17 * auVar57._8_4_ +
                           fVar245 * auVar64._8_4_ + fVar205 * auVar92._8_4_;
                      auVar59._12_4_ =
                           fVar176 * auVar57._12_4_ +
                           fVar247 * auVar64._12_4_ + fVar219 * auVar92._12_4_;
                      auVar183._0_4_ = auVar59._0_4_ + fVar208 + auVar182._0_4_;
                      auVar183._4_4_ = auVar59._4_4_ + fVar217 + auVar182._4_4_;
                      auVar183._8_4_ = auVar59._8_4_ + auVar214._8_4_ + auVar182._8_4_;
                      auVar183._12_4_ = auVar59._12_4_ + auVar214._12_4_ + auVar182._12_4_;
                      auVar92 = vandps_avx(auVar183,auVar154);
                      auVar84._0_4_ = auVar92._0_4_ * 1.1920929e-07;
                      auVar84._4_4_ = auVar92._4_4_ * 1.1920929e-07;
                      auVar84._8_4_ = auVar92._8_4_ * 1.1920929e-07;
                      auVar84._12_4_ = auVar92._12_4_ * 1.1920929e-07;
                      auVar92 = vminps_avx(auVar214,auVar182);
                      auVar92 = vminps_avx(auVar92,auVar59);
                      uVar38 = CONCAT44(auVar84._4_4_,auVar84._0_4_);
                      auVar127._0_8_ = uVar38 ^ 0x8000000080000000;
                      auVar127._8_4_ = -auVar84._8_4_;
                      auVar127._12_4_ = -auVar84._12_4_;
                      auVar92 = vcmpps_avx(auVar92,auVar127,5);
                      auVar57 = vmaxps_avx(auVar214,auVar182);
                      auVar64 = vmaxps_avx(auVar57,auVar59);
                      auVar64 = vcmpps_avx(auVar64,auVar84,2);
                      auVar92 = vorps_avx(auVar92,auVar64);
                      auVar64 = auVar103 & auVar92;
                      auVar92 = vandps_avx(auVar92,auVar103);
                      if ((((auVar64 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar64 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar64 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          auVar64[0xf] < '\0') {
                        auVar60._0_4_ = fVar174 * fVar96;
                        auVar60._4_4_ = fVar41 * fVar12;
                        auVar60._8_4_ = fVar207 * fVar70;
                        auVar60._12_4_ = fVar221 * fVar173;
                        auVar85._0_4_ = fVar237 * fVar133;
                        auVar85._4_4_ = fVar239 * fVar143;
                        auVar85._8_4_ = fVar244 * fVar158;
                        auVar85._12_4_ = fVar246 * fVar159;
                        auVar144 = vsubps_avx(auVar85,auVar60);
                        auVar110._0_4_ = fVar95 * fVar133;
                        auVar110._4_4_ = fVar98 * fVar143;
                        auVar110._8_4_ = fVar100 * fVar158;
                        auVar110._12_4_ = fVar123 * fVar159;
                        auVar128._0_4_ = fVar174 * fVar203;
                        auVar128._4_4_ = fVar41 * fVar69;
                        auVar128._8_4_ = fVar207 * fVar216;
                        auVar128._12_4_ = fVar221 * fVar175;
                        auVar141 = vsubps_avx(auVar128,auVar110);
                        auVar57 = vandps_avx(auVar60,auVar154);
                        auVar64 = vandps_avx(auVar110,auVar154);
                        auVar57 = vcmpps_avx(auVar57,auVar64,1);
                        auVar57 = vblendvps_avx(auVar141,auVar144,auVar57);
                        auVar61._0_4_ = fVar206 * fVar203;
                        auVar61._4_4_ = fVar218 * fVar69;
                        auVar61._8_4_ = fVar223 * fVar216;
                        auVar61._12_4_ = fVar233 * fVar175;
                        auVar86._0_4_ = fVar206 * fVar96;
                        auVar86._4_4_ = fVar218 * fVar12;
                        auVar86._8_4_ = fVar223 * fVar70;
                        auVar86._12_4_ = fVar233 * fVar173;
                        auVar111._0_4_ = fVar133 * fVar202;
                        auVar111._4_4_ = fVar143 * fVar189;
                        auVar111._8_4_ = fVar158 * fVar162;
                        auVar111._12_4_ = fVar159 * fVar14;
                        auVar141 = vsubps_avx(auVar86,auVar111);
                        auVar136._0_4_ = fVar133 * fVar187;
                        auVar136._4_4_ = fVar143 * fVar160;
                        auVar136._8_4_ = fVar158 * fVar177;
                        auVar136._12_4_ = fVar159 * fVar185;
                        auVar65 = vsubps_avx(auVar136,auVar61);
                        auVar64 = vandps_avx(auVar111,auVar154);
                        auVar144 = vandps_avx(auVar61,auVar154);
                        auVar64 = vcmpps_avx(auVar64,auVar144,1);
                        auVar141 = vblendvps_avx(auVar65,auVar141,auVar64);
                        auVar62._0_4_ = fVar174 * fVar187;
                        auVar62._4_4_ = fVar41 * fVar160;
                        auVar62._8_4_ = fVar207 * fVar177;
                        auVar62._12_4_ = fVar221 * fVar185;
                        auVar112._0_4_ = fVar174 * fVar202;
                        auVar112._4_4_ = fVar41 * fVar189;
                        auVar112._8_4_ = fVar207 * fVar162;
                        auVar112._12_4_ = fVar221 * fVar14;
                        auVar137._0_4_ = fVar206 * fVar237;
                        auVar137._4_4_ = fVar218 * fVar239;
                        auVar137._8_4_ = fVar223 * fVar244;
                        auVar137._12_4_ = fVar233 * fVar246;
                        auVar155._0_4_ = fVar206 * fVar95;
                        auVar155._4_4_ = fVar218 * fVar98;
                        auVar155._8_4_ = fVar223 * fVar100;
                        auVar155._12_4_ = fVar233 * fVar123;
                        auVar65 = vsubps_avx(auVar112,auVar137);
                        auVar130 = vsubps_avx(auVar155,auVar62);
                        auVar64 = vandps_avx(auVar154,auVar137);
                        auVar144 = vandps_avx(auVar154,auVar62);
                        auVar64 = vcmpps_avx(auVar64,auVar144,1);
                        auVar144 = vblendvps_avx(auVar130,auVar65,auVar64);
                        local_1b98 = auVar19._0_4_;
                        fStack_1b94 = auVar19._4_4_;
                        fStack_1b90 = auVar19._8_4_;
                        fVar96 = auVar57._0_4_ * local_1b98 +
                                 auVar144._0_4_ * fVar238 + auVar141._0_4_ * fVar101;
                        fVar202 = auVar57._4_4_ * fStack_1b94 +
                                  auVar144._4_4_ * fVar240 + auVar141._4_4_ * fVar204;
                        fVar101 = auVar57._8_4_ * fStack_1b90 +
                                  auVar144._8_4_ * fVar245 + auVar141._8_4_ * fVar205;
                        fVar174 = auVar57._12_4_ * fVar176 +
                                  auVar144._12_4_ * fVar247 + auVar141._12_4_ * fVar219;
                        auVar63._0_4_ = fVar96 + fVar96;
                        auVar63._4_4_ = fVar202 + fVar202;
                        auVar63._8_4_ = fVar101 + fVar101;
                        auVar63._12_4_ = fVar174 + fVar174;
                        fVar96 = auVar57._0_4_ * fVar9 +
                                 auVar144._0_4_ * fVar251 + auVar141._0_4_ * fVar161;
                        fVar202 = auVar57._4_4_ * fVar10 +
                                  auVar144._4_4_ * fVar252 + auVar141._4_4_ * fVar215;
                        fVar101 = auVar57._8_4_ * fVar188 +
                                  auVar144._8_4_ * fVar253 + auVar141._8_4_ * fVar220;
                        fVar174 = auVar57._12_4_ * fVar11 +
                                  auVar144._12_4_ * fVar254 + auVar141._12_4_ * fVar230;
                        auVar64 = vrcpps_avx(auVar63);
                        fVar9 = auVar64._0_4_;
                        auVar184._0_4_ = auVar63._0_4_ * fVar9;
                        fVar10 = auVar64._4_4_;
                        auVar184._4_4_ = auVar63._4_4_ * fVar10;
                        fVar188 = auVar64._8_4_;
                        auVar184._8_4_ = auVar63._8_4_ * fVar188;
                        fVar11 = auVar64._12_4_;
                        auVar184._12_4_ = auVar63._12_4_ * fVar11;
                        auVar201._8_4_ = 0x3f800000;
                        auVar201._0_8_ = 0x3f8000003f800000;
                        auVar201._12_4_ = 0x3f800000;
                        auVar64 = vsubps_avx(auVar201,auVar184);
                        auVar113._0_4_ = (fVar96 + fVar96) * (fVar9 + fVar9 * auVar64._0_4_);
                        auVar113._4_4_ = (fVar202 + fVar202) * (fVar10 + fVar10 * auVar64._4_4_);
                        auVar113._8_4_ = (fVar101 + fVar101) * (fVar188 + fVar188 * auVar64._8_4_);
                        auVar113._12_4_ = (fVar174 + fVar174) * (fVar11 + fVar11 * auVar64._12_4_);
                        auVar64 = vcmpps_avx(auVar113,*(undefined1 (*) [16])(ray + 0x80),2);
                        auVar65 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar113,2);
                        auVar64 = vandps_avx(auVar65,auVar64);
                        auVar65 = vcmpps_avx(auVar63,_DAT_01f45a50,4);
                        auVar64 = vandps_avx(auVar65,auVar64);
                        auVar64 = vpslld_avx(auVar64,0x1f);
                        auVar65 = vpsrad_avx(auVar64,0x1f);
                        auVar64 = auVar92 & auVar65;
                        auVar92 = vandps_avx(auVar92,auVar65);
                        if ((((auVar64 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar64 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar64 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            auVar64[0xf] < '\0') {
                          uStack_1a70 = auVar214._8_8_;
                          uStack_17e0 = uStack_1a70;
                          local_1848 = auVar144;
                          local_1838 = auVar141;
                          local_1828 = auVar57;
                          local_1818 = auVar113;
                          local_1808 = auVar183;
                          _local_17f8 = auVar182;
                          local_17e8 = auVar214._0_8_;
                        }
                      }
                      auVar236 = ZEXT1664(CONCAT412(0x7f800000,
                                                    CONCAT48(0x7f800000,0x7f8000007f800000)));
                      auVar228 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                    CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
                      auVar243 = ZEXT1664(CONCAT412(0x3f800003,
                                                    CONCAT48(0x3f800003,0x3f8000033f800003)));
                      auVar57 = vpcmpeqd_avx(auVar57,auVar57);
                      auVar132 = ZEXT1664(auVar57);
                      uVar5 = (pre.super_Precalculations.grid)->_geomID;
                      pGVar7 = (context->scene->geometries).items[uVar5].ptr;
                      uVar3 = pGVar7->mask;
                      auVar87._4_4_ = uVar3;
                      auVar87._0_4_ = uVar3;
                      auVar87._8_4_ = uVar3;
                      auVar87._12_4_ = uVar3;
                      auVar57 = vandps_avx(auVar87,*(undefined1 (*) [16])(ray + 0x90));
                      auVar57 = vpcmpeqd_avx(auVar57,_DAT_01f45a50);
                      auVar64 = auVar92 & ~auVar57;
                      if ((((auVar64 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar64 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar64 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          auVar64[0xf] < '\0') {
                        uVar3 = (pre.super_Precalculations.grid)->_primID;
                        auVar92 = vandnps_avx(auVar57,auVar92);
                        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                           (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                          auVar57 = vandps_avx(local_1808,auVar154);
                          auVar64 = vrcpps_avx(local_1808);
                          fVar9 = auVar64._0_4_;
                          auVar117._0_4_ = local_1808._0_4_ * fVar9;
                          fVar10 = auVar64._4_4_;
                          auVar117._4_4_ = local_1808._4_4_ * fVar10;
                          fVar188 = auVar64._8_4_;
                          auVar117._8_4_ = local_1808._8_4_ * fVar188;
                          fVar11 = auVar64._12_4_;
                          auVar117._12_4_ = local_1808._12_4_ * fVar11;
                          auVar157._8_4_ = 0x3f800000;
                          auVar157._0_8_ = 0x3f8000003f800000;
                          auVar157._12_4_ = 0x3f800000;
                          auVar64 = vsubps_avx(auVar157,auVar117);
                          auVar90._0_4_ = fVar9 + fVar9 * auVar64._0_4_;
                          auVar90._4_4_ = fVar10 + fVar10 * auVar64._4_4_;
                          auVar90._8_4_ = fVar188 + fVar188 * auVar64._8_4_;
                          auVar90._12_4_ = fVar11 + fVar11 * auVar64._12_4_;
                          auVar118._8_4_ = 0x219392ef;
                          auVar118._0_8_ = 0x219392ef219392ef;
                          auVar118._12_4_ = 0x219392ef;
                          auVar57 = vcmpps_avx(auVar57,auVar118,5);
                          auVar57 = vandps_avx(auVar57,auVar90);
                          auVar67._0_4_ = auVar57._0_4_ * (float)local_17e8;
                          auVar67._4_4_ = auVar57._4_4_ * local_17e8._4_4_;
                          auVar67._8_4_ = auVar57._8_4_ * (float)uStack_17e0;
                          auVar67._12_4_ = auVar57._12_4_ * uStack_17e0._4_4_;
                          auVar190 = vminps_avx(auVar67,auVar157);
                          auVar91._0_4_ = auVar57._0_4_ * (float)local_17f8._0_4_;
                          auVar91._4_4_ = auVar57._4_4_ * (float)local_17f8._4_4_;
                          auVar91._8_4_ = auVar57._8_4_ * fStack_17f0;
                          auVar91._12_4_ = auVar57._12_4_ * fStack_17ec;
                          auVar209 = vminps_avx(auVar91,auVar157);
                          uVar28 = *(undefined4 *)(local_1af8 + lVar36);
                          auVar119._4_4_ = uVar28;
                          auVar119._0_4_ = uVar28;
                          auVar119._8_4_ = uVar28;
                          auVar119._12_4_ = uVar28;
                          auVar64 = vpsrld_avx(auVar119,0x10);
                          auVar65 = ZEXT816(0) << 0x40;
                          auVar57 = vpblendw_avx(auVar119,auVar65,0xaa);
                          auVar57 = vcvtdq2ps_avx(auVar57);
                          auVar64 = vcvtdq2ps_avx(auVar64);
                          uVar28 = *(undefined4 *)(local_1af8 + lVar36 + 4);
                          auVar140._4_4_ = uVar28;
                          auVar140._0_4_ = uVar28;
                          auVar140._8_4_ = uVar28;
                          auVar140._12_4_ = uVar28;
                          auVar144 = vsubps_avx(auVar157,auVar190);
                          auVar210 = vsubps_avx(auVar144,auVar209);
                          auVar144 = vpblendw_avx(auVar140,auVar65,0xaa);
                          auVar144 = vcvtdq2ps_avx(auVar144);
                          auVar141 = vpsrld_avx(auVar140,0x10);
                          auVar141 = vcvtdq2ps_avx(auVar141);
                          uVar28 = *(undefined4 *)(local_1b00 + lVar36);
                          auVar142._4_4_ = uVar28;
                          auVar142._0_4_ = uVar28;
                          auVar142._8_4_ = uVar28;
                          auVar142._12_4_ = uVar28;
                          auVar65 = vpblendw_avx(auVar142,auVar65,0xaa);
                          auVar65 = vcvtdq2ps_avx(auVar65);
                          auVar130 = vpsrld_avx(auVar142,0x10);
                          auVar130 = vcvtdq2ps_avx(auVar130);
                          auVar131._0_4_ = auVar130._0_4_ * 0.00012207031;
                          auVar131._4_4_ = auVar130._4_4_ * 0.00012207031;
                          auVar131._8_4_ = auVar130._8_4_ * 0.00012207031;
                          auVar131._12_4_ = auVar130._12_4_ * 0.00012207031;
                          local_19d8._0_8_ = local_1828._0_8_;
                          local_19d8._8_8_ = local_1828._8_8_;
                          local_19d8._16_8_ = local_1838._0_8_;
                          local_19d8._24_8_ = local_1838._8_8_;
                          local_19d8._32_8_ = local_1848._0_8_;
                          local_19d8._40_8_ = local_1848._8_8_;
                          local_19a8 = local_1818._0_8_;
                          uStack_19a0 = local_1818._8_8_;
                          fStack_1994 = auVar190._4_4_ * auVar131._4_4_ +
                                        auVar210._4_4_ * auVar64._4_4_ * 0.00012207031 +
                                        auVar209._4_4_ * auVar141._4_4_ * 0.00012207031;
                          local_1998 = auVar190._0_4_ * auVar131._0_4_ +
                                       auVar210._0_4_ * auVar64._0_4_ * 0.00012207031 +
                                       auVar209._0_4_ * auVar141._0_4_ * 0.00012207031;
                          fStack_1990 = auVar190._8_4_ * auVar131._8_4_ +
                                        auVar210._8_4_ * auVar64._8_4_ * 0.00012207031 +
                                        auVar209._8_4_ * auVar141._8_4_ * 0.00012207031;
                          fStack_198c = auVar190._12_4_ * auVar131._12_4_ +
                                        auVar210._12_4_ * auVar64._12_4_ * 0.00012207031 +
                                        auVar209._12_4_ * auVar141._12_4_ * 0.00012207031;
                          local_1988._4_4_ =
                               auVar190._4_4_ * auVar65._4_4_ * 0.00012207031 +
                               auVar210._4_4_ * auVar57._4_4_ * 0.00012207031 +
                               auVar209._4_4_ * auVar144._4_4_ * 0.00012207031;
                          local_1988._0_4_ =
                               auVar190._0_4_ * auVar65._0_4_ * 0.00012207031 +
                               auVar210._0_4_ * auVar57._0_4_ * 0.00012207031 +
                               auVar209._0_4_ * auVar144._0_4_ * 0.00012207031;
                          fStack_1980 = auVar190._8_4_ * auVar65._8_4_ * 0.00012207031 +
                                        auVar210._8_4_ * auVar57._8_4_ * 0.00012207031 +
                                        auVar209._8_4_ * auVar144._8_4_ * 0.00012207031;
                          fStack_197c = auVar190._12_4_ * auVar65._12_4_ * 0.00012207031 +
                                        auVar210._12_4_ * auVar57._12_4_ * 0.00012207031 +
                                        auVar209._12_4_ * auVar144._12_4_ * 0.00012207031;
                          args.valid = (int *)&Ng;
                          args.geometryUserPtr = &t;
                          args.context = (RTCRayQueryContext *)&v;
                          args.ray = (RTCRayN *)&u;
                          std::
                          _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
                          ::
                          _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                                    ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                                      *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                                               *)&local_19d8.field_0);
                          local_1978 = vpshufd_avx(ZEXT416(uVar5),0);
                          _local_1988 = vshufps_avx(ZEXT416(uVar3),ZEXT416(uVar3),0);
                          local_19d8._0_8_ = Ng.field_0._0_8_;
                          local_19d8._8_8_ = Ng.field_0._8_8_;
                          local_19d8._16_8_ = Ng.field_0._16_8_;
                          local_19d8._24_8_ = Ng.field_0._24_8_;
                          local_19d8._32_8_ = Ng.field_0._32_8_;
                          local_19d8._40_8_ = Ng.field_0._40_8_;
                          local_19a8 = u.field_0._0_8_;
                          uStack_19a0 = u.field_0._8_8_;
                          vcmpps_avx(ZEXT1632(local_1978),ZEXT1632(local_1978),0xf);
                          uStack_1964 = context->user->instID[0];
                          local_1968 = uStack_1964;
                          uStack_1960 = uStack_1964;
                          uStack_195c = uStack_1964;
                          uStack_1958 = context->user->instPrimID[0];
                          uStack_1954 = uStack_1958;
                          uStack_1950 = uStack_1958;
                          uStack_194c = uStack_1958;
                          auVar57 = *(undefined1 (*) [16])(ray + 0x80);
                          auVar64 = vblendvps_avx(auVar57,(undefined1  [16])t.field_0,auVar92);
                          *(undefined1 (*) [16])(ray + 0x80) = auVar64;
                          args.valid = (int *)local_1b18;
                          args.geometryUserPtr = pGVar7->userPtr;
                          args.context = context->user;
                          args.hit = (RTCHitN *)&local_19d8;
                          args.N = 4;
                          args.ray = (RTCRayN *)ray;
                          local_1b18 = auVar92;
                          if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            (*pGVar7->occlusionFilterN)(&args);
                          }
                          if (local_1b18 == (undefined1  [16])0x0) {
                            auVar92 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                            auVar64 = vpcmpeqd_avx(auVar131,auVar131);
                            auVar132 = ZEXT1664(auVar64);
                            auVar92 = auVar92 ^ auVar64;
                            auVar236 = ZEXT1664(CONCAT412(0x7f800000,
                                                          CONCAT48(0x7f800000,0x7f8000007f800000)));
                            auVar228 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                          CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
                            auVar243 = ZEXT1664(CONCAT412(0x3f800003,
                                                          CONCAT48(0x3f800003,0x3f8000033f800003)));
                          }
                          else {
                            p_Var8 = context->args->filter;
                            auVar92 = vpcmpeqd_avx(auVar131,auVar131);
                            auVar132 = ZEXT1664(auVar92);
                            if (p_Var8 == (RTCFilterFunctionN)0x0) {
                              auVar236 = ZEXT1664(CONCAT412(0x7f800000,
                                                            CONCAT48(0x7f800000,0x7f8000007f800000))
                                                 );
                              auVar228 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                            CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa))
                                                 );
                              auVar243 = ZEXT1664(CONCAT412(0x3f800003,
                                                            CONCAT48(0x3f800003,0x3f8000033f800003))
                                                 );
                            }
                            else {
                              auVar236 = ZEXT1664(CONCAT412(0x7f800000,
                                                            CONCAT48(0x7f800000,0x7f8000007f800000))
                                                 );
                              auVar228 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                            CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa))
                                                 );
                              auVar243 = ZEXT1664(CONCAT412(0x3f800003,
                                                            CONCAT48(0x3f800003,0x3f8000033f800003))
                                                 );
                              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                 (((pGVar7->field_8).field_0x2 & 0x40) != 0)) {
                                (*p_Var8)(&args);
                                auVar92 = vpcmpeqd_avx(auVar92,auVar92);
                                auVar132 = ZEXT1664(auVar92);
                                auVar243 = ZEXT1664(CONCAT412(0x3f800003,
                                                              CONCAT48(0x3f800003,0x3f8000033f800003
                                                                      )));
                                auVar228 = ZEXT1664(CONCAT412(0x3f7ffffa,
                                                              CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa
                                                                      )));
                                auVar236 = ZEXT1664(CONCAT412(0x7f800000,
                                                              CONCAT48(0x7f800000,0x7f8000007f800000
                                                                      )));
                              }
                            }
                            auVar64 = vpcmpeqd_avx(local_1b18,_DAT_01f45a50);
                            auVar92 = auVar64 ^ auVar132._0_16_;
                            auVar121._8_4_ = 0xff800000;
                            auVar121._0_8_ = 0xff800000ff800000;
                            auVar121._12_4_ = 0xff800000;
                            auVar64 = vblendvps_avx(auVar121,*(undefined1 (*) [16])(args.ray + 0x80)
                                                    ,auVar64);
                            *(undefined1 (*) [16])(args.ray + 0x80) = auVar64;
                          }
                          auVar64 = vpslld_avx(auVar92,0x1f);
                          auVar92 = vpsrad_avx(auVar64,0x1f);
                          auVar57 = vblendvps_avx(auVar57,*(undefined1 (*) [16])local_1b08,auVar64);
                          *(undefined1 (*) [16])local_1b08 = auVar57;
                        }
                        auVar103 = vpandn_avx(auVar92,auVar103);
                      }
                      auVar94 = ZEXT1664(auVar103);
                      lVar36 = lVar36 + 4;
                    } while ((((auVar103 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                              || (auVar103 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                              ) || (auVar103 >> 0x5f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) || auVar103[0xf] < '\0');
                    local_1af8 = local_1af8 + lVar2;
                    local_1ae0 = local_1ae0 + lVar2;
                    local_1ae8 = local_1ae8 + lVar2;
                    local_1af0 = local_1af0 + lVar2;
                    local_1b00 = local_1b00 + lVar2;
                    local_1aa0 = local_1aa0 + lVar2;
                    local_1aa8 = local_1aa8 + lVar2;
                    lVar31 = lVar31 + lVar2;
                  }
                  auVar68 = auVar94._0_16_ ^ auVar132._0_16_;
                  sVar30 = 0;
                }
                else {
                  pre.super_Precalculations.grid = (GridSOA *)(root.ptr & 0xfffffffffffffff0);
                  sVar30 = *(size_t *)
                            ((pre.super_Precalculations.grid)->data +
                            (pre.super_Precalculations.grid)->rootOffset);
                  auVar68._8_8_ = uVar23;
                  auVar68._0_8_ = uVar22;
                  auVar92 = vpcmpeqd_avx(auVar92,auVar92);
                  auVar132 = ZEXT1664(auVar92);
                }
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     vpor_avx(auVar68,(undefined1  [16])terminated.field_0);
                auVar92 = auVar132._0_16_ & ~(undefined1  [16])terminated.field_0;
                if ((((auVar92 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar92 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar92 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar92[0xf]) goto LAB_00ecc47b;
                auVar94 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
                auVar122._8_4_ = 0xff800000;
                auVar122._0_8_ = 0xff800000ff800000;
                auVar122._12_4_ = 0xff800000;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar122,
                                   (undefined1  [16])terminated.field_0);
                if (sVar30 != 0) {
                  pNVar35->ptr = sVar30;
                  pNVar35 = pNVar35 + 1;
                  paVar39->i[0] = -0x800000;
                  paVar39->i[1] = -0x800000;
                  paVar39->i[2] = -0x800000;
                  paVar39->i[3] = -0x800000;
                  paVar39 = paVar39 + 1;
                }
              }
              goto LAB_00ecab19;
            }
            auVar92 = auVar236._0_16_;
            for (lVar31 = 0;
                (auVar256 = ZEXT1664(auVar92), lVar31 != 4 &&
                (sVar6 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar31 * 8), sVar6 != 8));
                lVar31 = lVar31 + 1) {
              uVar28 = *(undefined4 *)(root.ptr + 0x20 + lVar31 * 4);
              auVar42._4_4_ = uVar28;
              auVar42._0_4_ = uVar28;
              auVar42._8_4_ = uVar28;
              auVar42._12_4_ = uVar28;
              auVar103._8_8_ = tray.org.field_0._8_8_;
              auVar103._0_8_ = tray.org.field_0._0_8_;
              auVar18._8_8_ = tray.org.field_0._24_8_;
              auVar18._0_8_ = tray.org.field_0._16_8_;
              auVar125._8_8_ = tray.org.field_0._40_8_;
              auVar125._0_8_ = tray.org.field_0._32_8_;
              auVar57 = vsubps_avx(auVar42,auVar103);
              auVar145._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar57._0_4_;
              auVar145._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar57._4_4_;
              auVar145._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar57._8_4_;
              auVar145._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar57._12_4_;
              uVar28 = *(undefined4 *)(root.ptr + 0x40 + lVar31 * 4);
              auVar43._4_4_ = uVar28;
              auVar43._0_4_ = uVar28;
              auVar43._8_4_ = uVar28;
              auVar43._12_4_ = uVar28;
              auVar57 = vsubps_avx(auVar43,auVar18);
              auVar178._0_4_ = tray.rdir.field_0._16_4_ * auVar57._0_4_;
              auVar178._4_4_ = tray.rdir.field_0._20_4_ * auVar57._4_4_;
              auVar178._8_4_ = tray.rdir.field_0._24_4_ * auVar57._8_4_;
              auVar178._12_4_ = tray.rdir.field_0._28_4_ * auVar57._12_4_;
              uVar28 = *(undefined4 *)(root.ptr + 0x60 + lVar31 * 4);
              auVar44._4_4_ = uVar28;
              auVar44._0_4_ = uVar28;
              auVar44._8_4_ = uVar28;
              auVar44._12_4_ = uVar28;
              auVar57 = vsubps_avx(auVar44,auVar125);
              auVar211._0_4_ = tray.rdir.field_0._32_4_ * auVar57._0_4_;
              auVar211._4_4_ = tray.rdir.field_0._36_4_ * auVar57._4_4_;
              auVar211._8_4_ = tray.rdir.field_0._40_4_ * auVar57._8_4_;
              auVar211._12_4_ = tray.rdir.field_0._44_4_ * auVar57._12_4_;
              uVar28 = *(undefined4 *)(root.ptr + 0x30 + lVar31 * 4);
              auVar45._4_4_ = uVar28;
              auVar45._0_4_ = uVar28;
              auVar45._8_4_ = uVar28;
              auVar45._12_4_ = uVar28;
              auVar57 = vsubps_avx(auVar45,auVar103);
              auVar72._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar57._0_4_;
              auVar72._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar57._4_4_;
              auVar72._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar57._8_4_;
              auVar72._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar57._12_4_;
              uVar28 = *(undefined4 *)(root.ptr + 0x50 + lVar31 * 4);
              auVar46._4_4_ = uVar28;
              auVar46._0_4_ = uVar28;
              auVar46._8_4_ = uVar28;
              auVar46._12_4_ = uVar28;
              auVar57 = vsubps_avx(auVar46,auVar18);
              auVar104._0_4_ = tray.rdir.field_0._16_4_ * auVar57._0_4_;
              auVar104._4_4_ = tray.rdir.field_0._20_4_ * auVar57._4_4_;
              auVar104._8_4_ = tray.rdir.field_0._24_4_ * auVar57._8_4_;
              auVar104._12_4_ = tray.rdir.field_0._28_4_ * auVar57._12_4_;
              uVar28 = *(undefined4 *)(root.ptr + 0x70 + lVar31 * 4);
              auVar47._4_4_ = uVar28;
              auVar47._0_4_ = uVar28;
              auVar47._8_4_ = uVar28;
              auVar47._12_4_ = uVar28;
              auVar57 = vsubps_avx(auVar47,auVar125);
              auVar124._0_4_ = tray.rdir.field_0._32_4_ * auVar57._0_4_;
              auVar124._4_4_ = tray.rdir.field_0._36_4_ * auVar57._4_4_;
              auVar124._8_4_ = tray.rdir.field_0._40_4_ * auVar57._8_4_;
              auVar124._12_4_ = tray.rdir.field_0._44_4_ * auVar57._12_4_;
              auVar132 = ZEXT1664(auVar124);
              auVar57 = vminps_avx(auVar145,auVar72);
              auVar64 = vminps_avx(auVar178,auVar104);
              auVar57 = vmaxps_avx(auVar57,auVar64);
              auVar64 = vminps_avx(auVar211,auVar124);
              auVar57 = vmaxps_avx(auVar57,auVar64);
              auVar48._0_4_ = auVar228._0_4_ * auVar57._0_4_;
              auVar48._4_4_ = auVar228._4_4_ * auVar57._4_4_;
              auVar48._8_4_ = auVar228._8_4_ * auVar57._8_4_;
              auVar48._12_4_ = auVar228._12_4_ * auVar57._12_4_;
              auVar57 = vmaxps_avx(auVar145,auVar72);
              auVar64 = vmaxps_avx(auVar178,auVar104);
              auVar64 = vminps_avx(auVar57,auVar64);
              auVar57 = vmaxps_avx(auVar211,auVar124);
              auVar57 = vminps_avx(auVar64,auVar57);
              auVar73._0_4_ = auVar243._0_4_ * auVar57._0_4_;
              auVar73._4_4_ = auVar243._4_4_ * auVar57._4_4_;
              auVar73._8_4_ = auVar243._8_4_ * auVar57._8_4_;
              auVar73._12_4_ = auVar243._12_4_ * auVar57._12_4_;
              auVar57 = vmaxps_avx(auVar48,(undefined1  [16])tray.tnear.field_0);
              auVar64 = vminps_avx(auVar73,(undefined1  [16])tray.tfar.field_0);
              auVar64 = vcmpps_avx(auVar57,auVar64,2);
              auVar94 = ZEXT1664(auVar64);
              sVar25 = sVar30;
              auVar57 = auVar92;
              if (((((auVar64 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                    (auVar64 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar64 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   auVar64[0xf] < '\0') &&
                 (auVar57 = vblendvps_avx(auVar236._0_16_,auVar48,auVar64), sVar25 = sVar6,
                 sVar30 != 8)) {
                pNVar35->ptr = sVar30;
                pNVar35 = pNVar35 + 1;
                *(undefined1 (*) [16])paVar39->v = auVar92;
                paVar39 = paVar39 + 1;
              }
              auVar92 = auVar57;
              sVar30 = sVar25;
            }
            if (sVar30 == 8) goto LAB_00ecacdd;
            auVar57 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar92,6);
            uVar28 = vmovmskps_avx(auVar57);
            root.ptr = sVar30;
          } while ((byte)uVar37 < (byte)POPCOUNT(uVar28));
          pNVar35->ptr = sVar30;
          pNVar35 = pNVar35 + 1;
          *(undefined1 (*) [16])paVar39->v = auVar92;
          paVar39 = paVar39 + 1;
        }
        else {
          auVar92 = vpcmpeqd_avx(auVar94._0_16_,auVar94._0_16_);
          auVar94 = ZEXT1664(auVar92);
          while (auVar92 = auVar94._0_16_, uVar38 != 0) {
            sVar30 = 0;
            if (uVar38 != 0) {
              for (; (uVar38 >> sVar30 & 1) == 0; sVar30 = sVar30 + 1) {
              }
            }
            uVar38 = uVar38 & uVar38 - 1;
            auVar132 = ZEXT1664(auVar132._0_16_);
            bVar26 = occluded1(This,bvh,root,sVar30,&pre,ray,&tray,context);
            auVar92 = vpcmpeqd_avx(auVar92,auVar92);
            auVar94 = ZEXT1664(auVar92);
            if (bVar26) {
              terminated.field_0.i[sVar30] = -1;
            }
          }
          auVar92 = auVar92 & ~(undefined1  [16])terminated.field_0;
          iVar29 = 3;
          auVar236 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar228 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar243 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
          auVar256 = ZEXT1664((undefined1  [16])vVar4.field_0);
          if ((((auVar92 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar92 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar92 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar92[0xf] < '\0') {
            auVar94 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
            auVar92._8_4_ = 0xff800000;
            auVar92._0_8_ = 0xff800000ff800000;
            auVar92._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar92,
                               (undefined1  [16])terminated.field_0);
            iVar29 = 2;
          }
          if (uVar37 < uVar27) goto LAB_00ecab59;
        }
LAB_00ecacdd:
      } while ((iVar29 == 4) || (iVar29 == 2));
LAB_00ecc47b:
      auVar13 = vandps_avx(auVar13,(undefined1  [16])terminated.field_0);
      auVar93._8_4_ = 0xff800000;
      auVar93._0_8_ = 0xff800000ff800000;
      auVar93._12_4_ = 0xff800000;
      auVar13 = vmaskmovps_avx(auVar13,auVar93);
      *(undefined1 (*) [16])local_1b08 = auVar13;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }